

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFileLogTests::generateFileNameFixture::~generateFileNameFixture(generateFileNameFixture *this)

{
  allocator<char> local_59;
  string local_58;
  allocator<char> local_31;
  string local_30;
  generateFileNameFixture *local_10;
  generateFileNameFixture *this_local;
  
  local_10 = this;
  FIX::FileLogFactory::destroy((Log *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GENERATEFILENAME",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"TEST",&local_59);
  deleteLogSession(&local_30,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  FIX::FileLogFactory::~FileLogFactory(&this->fileLogFactory);
  return;
}

Assistant:

~generateFileNameFixture()
  {
    fileLogFactory.destroy( object );
    deleteLogSession( "GENERATEFILENAME", "TEST" );
  }